

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void outlet_symbol(_outlet *x,t_symbol *s)

{
  _outconnect *local_20;
  _outconnect *oc;
  t_symbol *s_local;
  _outlet *x_local;
  
  stackcount = stackcount + 1;
  if (stackcount < 1000) {
    for (local_20 = x->o_connections; local_20 != (_outconnect *)0x0; local_20 = local_20->oc_next)
    {
      pd_symbol(local_20->oc_to,s);
    }
  }
  else {
    outlet_stackerror(x);
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_symbol(t_outlet *x, t_symbol *s)
{
    t_outconnect *oc;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    for (oc = x->o_connections; oc; oc = oc->oc_next)
        pd_symbol(oc->oc_to, s);
    --stackcount;
}